

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

uchar ws_frame_flags2firstbyte(Curl_easy *data,uint flags,_Bool contfragment,CURLcode *err)

{
  CURLcode *err_local;
  _Bool contfragment_local;
  uint flags_local;
  Curl_easy *data_local;
  
  switch(flags & 0xffffffdf) {
  case 0:
    if (contfragment) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,
                   "WS: no flags given; interpreting as continuation fragment for compatibility");
      }
      data_local._7_1_ = 0x80;
    }
    else {
      Curl_failf(data,"WS: no flags given");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      data_local._7_1_ = 0xff;
    }
    break;
  case 1:
    data_local._7_1_ = 0x81;
    if (contfragment) {
      data_local._7_1_ = 0x80;
    }
    break;
  case 2:
    data_local._7_1_ = 0x82;
    if (contfragment) {
      data_local._7_1_ = 0x80;
    }
    break;
  default:
    Curl_failf(data,"WS: unknown flags: %x",(ulong)flags);
    *err = CURLE_SEND_ERROR;
    data_local._7_1_ = 0xff;
    break;
  case 4:
    if (contfragment) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,
                   "WS: setting CURLWS_CONT flag without message type is supported for compatibility but highly discouraged"
                  );
      }
      data_local._7_1_ = '\0';
    }
    else {
      Curl_failf(data,"WS: No ongoing fragmented message to continue");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      data_local._7_1_ = 0xff;
    }
    break;
  case 5:
    data_local._7_1_ = !contfragment;
    break;
  case 6:
    data_local._7_1_ = '\x02';
    if (contfragment) {
      data_local._7_1_ = '\0';
    }
    break;
  case 8:
    data_local._7_1_ = 0x88;
    break;
  case 0xc:
    Curl_failf(data,"WS: CLOSE frame must not be fragmented");
    *err = CURLE_BAD_FUNCTION_ARGUMENT;
    data_local._7_1_ = 0xff;
    break;
  case 0x10:
    data_local._7_1_ = 0x89;
    break;
  case 0x14:
    Curl_failf(data,"WS: PING frame must not be fragmented");
    *err = CURLE_BAD_FUNCTION_ARGUMENT;
    data_local._7_1_ = 0xff;
    break;
  case 0x40:
    data_local._7_1_ = 0x8a;
    break;
  case 0x44:
    Curl_failf(data,"WS: PONG frame must not be fragmented");
    *err = CURLE_BAD_FUNCTION_ARGUMENT;
    data_local._7_1_ = 0xff;
  }
  return data_local._7_1_;
}

Assistant:

static unsigned char ws_frame_flags2firstbyte(struct Curl_easy *data,
                                              unsigned int flags,
                                              bool contfragment,
                                              CURLcode *err)
{
  switch(flags & ~CURLWS_OFFSET) {
    case 0:
      if(contfragment) {
        infof(data, "WS: no flags given; interpreting as continuation "
                    "fragment for compatibility");
        return (WSBIT_OPCODE_CONT | WSBIT_FIN);
      }
      failf(data, "WS: no flags given");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      return 0xff;
    case CURLWS_CONT:
      if(contfragment) {
        infof(data, "WS: setting CURLWS_CONT flag without message type is "
                    "supported for compatibility but highly discouraged");
        return WSBIT_OPCODE_CONT;
      }
      failf(data, "WS: No ongoing fragmented message to continue");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      return 0xff;
    case CURLWS_TEXT:
      return contfragment ? (WSBIT_OPCODE_CONT | WSBIT_FIN)
                          : (WSBIT_OPCODE_TEXT | WSBIT_FIN);
    case (CURLWS_TEXT | CURLWS_CONT):
      return contfragment ? WSBIT_OPCODE_CONT : WSBIT_OPCODE_TEXT;
    case CURLWS_BINARY:
      return contfragment ? (WSBIT_OPCODE_CONT | WSBIT_FIN)
                          : (WSBIT_OPCODE_BIN | WSBIT_FIN);
    case (CURLWS_BINARY | CURLWS_CONT):
      return contfragment ? WSBIT_OPCODE_CONT : WSBIT_OPCODE_BIN;
    case CURLWS_CLOSE:
      return WSBIT_OPCODE_CLOSE | WSBIT_FIN;
    case (CURLWS_CLOSE | CURLWS_CONT):
      failf(data, "WS: CLOSE frame must not be fragmented");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      return 0xff;
    case CURLWS_PING:
      return WSBIT_OPCODE_PING | WSBIT_FIN;
    case (CURLWS_PING | CURLWS_CONT):
      failf(data, "WS: PING frame must not be fragmented");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      return 0xff;
    case CURLWS_PONG:
      return WSBIT_OPCODE_PONG | WSBIT_FIN;
    case (CURLWS_PONG | CURLWS_CONT):
      failf(data, "WS: PONG frame must not be fragmented");
      *err = CURLE_BAD_FUNCTION_ARGUMENT;
      return 0xff;
    default:
      failf(data, "WS: unknown flags: %x", flags);
      *err = CURLE_SEND_ERROR;
      return 0xff;
  }
}